

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmResourceInfoCommon::GetPaddedWidth(GmmResourceInfoCommon *this,uint32_t MipLevel)

{
  int iVar1;
  uint32_t Width;
  undefined4 extraout_var;
  GMM_TEXTURE_CALC *this_00;
  uint32_t local_54;
  uint32_t local_34;
  uint32_t HAlign;
  GMM_GFX_SIZE_T MipWidth;
  uint32_t AlignedWidth;
  GMM_TEXTURE_CALC *pTextureCalc;
  uint32_t MipLevel_local;
  GmmResourceInfoCommon *this_local;
  
  iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  this_00 = GmmGetTextureCalc((GMM_LIB_CONTEXT *)CONCAT44(extraout_var,iVar1));
  Width = (*this_00->_vptr_GmmTextureCalc[0x18])(this_00,&this->Surf,(ulong)MipLevel);
  local_34 = (this->Surf).Alignment.HAlign;
  if ((((ulong)(this->AuxSurf).Flags.Gpu >> 1 & 1) != 0) &&
     (((ulong)(this->AuxSurf).Flags.Gpu >> 0x29 & 1) != 0)) {
    local_34 = (this->AuxSurf).Alignment.HAlign;
  }
  if ((((ulong)(this->Surf).Flags.Gpu >> 6 & 1) == 0) &&
     (((ulong)(this->Surf).Flags.Gpu >> 0x1d & 1) == 0)) {
    local_54 = 1;
  }
  else {
    local_54 = (this->Surf).MSAA.NumSamples;
  }
  MipWidth._4_4_ = GmmTextureCalc::ExpandWidth(this_00,Width,local_34,local_54);
  if (((ulong)(this->Surf).Flags.Gpu >> 0x1d & 1) != 0) {
    if (((ulong)(this->Surf).Flags.Info >> 0x22 & 1) != 0) {
      MipWidth._4_4_ = MipWidth._4_4_ << 1;
    }
    switch((this->Surf).MSAA.NumSamples) {
    case 1:
      break;
    case 2:
    case 4:
      MipWidth._4_4_ = MipWidth._4_4_ >> 1;
      break;
    default:
      break;
    case 8:
    case 0x10:
      MipWidth._4_4_ = MipWidth._4_4_ >> 2;
    }
  }
  if ((((ulong)(this->AuxSurf).Flags.Gpu >> 1 & 1) != 0) &&
     (((ulong)(this->AuxSurf).Flags.Gpu >> 0x29 & 1) != 0)) {
    MipWidth._4_4_ =
         (*this_00->_vptr_GmmTextureCalc[0x16])(this_00,&this->AuxSurf,(ulong)MipWidth._4_4_);
  }
  return MipWidth._4_4_;
}

Assistant:

uint32_t GMM_STDCALL GmmLib::GmmResourceInfoCommon::GetPaddedWidth(uint32_t MipLevel)
{
    GMM_TEXTURE_CALC *pTextureCalc;
    uint32_t          AlignedWidth;
    GMM_GFX_SIZE_T    MipWidth;
    uint32_t          HAlign;

    __GMM_ASSERT(MipLevel <= Surf.MaxLod);

    pTextureCalc = GMM_OVERRIDE_TEXTURE_CALC(&Surf, GetGmmLibContext());

    // This shall be called for Depth and Separate Stencil main surface resource
    // This shall be called for the Aux surfaces (MCS, CCS and Hiz) too.
    // MCS will have Surf.Flags.Gpu.CCS set
    // Hiz will have Surf.Flags.Gpu.HiZ set
    __GMM_ASSERT(Surf.Flags.Gpu.Depth || Surf.Flags.Gpu.SeparateStencil ||
                 Surf.Flags.Gpu.CCS || Surf.Flags.Gpu.HiZ ||
                 AuxSurf.Flags.Gpu.__MsaaTileMcs ||
                 AuxSurf.Flags.Gpu.CCS || AuxSurf.Flags.Gpu.__NonMsaaTileYCcs);

    MipWidth = pTextureCalc->GmmTexGetMipWidth(&Surf, MipLevel);

    HAlign = Surf.Alignment.HAlign;
    if(AuxSurf.Flags.Gpu.CCS && AuxSurf.Flags.Gpu.__NonMsaaTileYCcs)
    {
        HAlign = AuxSurf.Alignment.HAlign;
    }

    AlignedWidth = __GMM_EXPAND_WIDTH(pTextureCalc,
                                      GFX_ULONG_CAST(MipWidth),
                                      HAlign,
                                      &Surf);

    if(Surf.Flags.Gpu.SeparateStencil)
    {
        if(Surf.Flags.Info.TiledW)
        {
            AlignedWidth *= 2;
        }

        // Reverse MSAA Expansion ////////////////////////////////////////////////
        // It might seem strange that we ExpandWidth (with consideration for MSAA)
        // only to "reverse" the MSAA portion of the expansion...It's an order-of-
        // operations thing--The intention of the reversal isn't to have
        // disregarded the original MSAA expansion but to produce a width, that
        // when MSAA'ed will match the true physical width (which requires MSAA
        // consideration to compute).
        switch(Surf.MSAA.NumSamples)
        {
            case 1:
                break;
            case 2: // Same as 4x...
            case 4:
                AlignedWidth /= 2;
                break;
            case 8: // Same as 16x...
            case 16:
                AlignedWidth /= 4;
                break;
            default:
                __GMM_ASSERT(0);
        }
    }

    // CCS Aux surface, Aligned width needs to be scaled based on main surface bpp
    if(AuxSurf.Flags.Gpu.CCS && AuxSurf.Flags.Gpu.__NonMsaaTileYCcs)
    {
        AlignedWidth = pTextureCalc->ScaleTextureWidth(&AuxSurf, AlignedWidth);
    }

    return AlignedWidth;
}